

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

ObjTypeSpecFldInfo *
ObjTypeSpecFldInfo::CreateFrom
          (uint id,PolymorphicInlineCache *cache,uint cacheId,EntryPointInfo *entryPoint,
          FunctionBody *topFunctionBody,FunctionBody *functionBody,
          FieldAccessStatsPtr inlineCacheStats)

{
  long *plVar1;
  DynamicType *this;
  code *pcVar2;
  FunctionBody *this_00;
  RecyclerJITTypeHolder *pRVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  PropertyId propertyId;
  undefined4 *puVar8;
  DynamicProfileInfo *pDVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ulong uVar10;
  ScriptContext *this_01;
  PropertyRecord *pPVar11;
  Recycler *pRVar12;
  NativeEntryPointData *this_02;
  PropertyGuard *pPVar13;
  intptr_t iVar14;
  Recycler *pRVar15;
  JITTypeHolderBase<Memory::Recycler> *pJVar16;
  JITType *this_03;
  EquivalentTypeSet *this_04;
  ObjTypeSpecFldInfo *this_05;
  JITTypeHolder JVar17;
  ObjTypeSpecPolymorphicInfo *pOVar18;
  Type TVar19;
  uint16 i_1;
  ulong uVar20;
  Type *type;
  JavascriptLibrary *pJVar21;
  ulong uVar22;
  size_t sVar23;
  TypeId TVar24;
  ulong uVar25;
  Var pvVar26;
  InlineCache *this_06;
  short sVar27;
  ushort uVar28;
  char cVar29;
  uint16 i;
  uint uVar30;
  byte bVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong *puVar35;
  ulong uVar36;
  undefined1 local_438 [8];
  FixedFieldInfo localFixedFieldInfoArray [4];
  Type *localTypes [32];
  ObjTypeSpecPolymorphicInfo localPolymorphicInfo [32];
  undefined **local_120;
  JavascriptFunction *fixedFunctionObject;
  JavascriptLibrary *local_110;
  char *local_108;
  DWORD local_100;
  Var local_f8;
  Var fixedProperty;
  ulong local_e8;
  DynamicObject *local_e0;
  uint local_d4;
  ulong local_d0;
  FixedFieldInfo *local_c8;
  TypeId local_bc;
  ulong local_b8;
  ScriptContext *local_b0;
  ulong local_a8;
  undefined4 *local_a0;
  FunctionBody *local_98;
  ulong local_90;
  undefined8 local_88;
  ulong local_80;
  JavascriptLibrary *local_78;
  uint local_6c;
  Phases *local_68;
  uint local_5c;
  uint local_58;
  uint16 local_52;
  RecyclerJITTypeHolder *local_50;
  undefined8 local_48;
  undefined8 local_40;
  uint local_34;
  undefined7 extraout_var_02;
  
  local_98 = functionBody;
  local_5c = cacheId;
  if ((topFunctionBody->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2d6,"(topFunctionBody->HasDynamicProfileInfo())",
                       "topFunctionBody->HasDynamicProfileInfo()");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
  }
  pDVar9 = Js::FunctionBody::GetAnyDynamicProfileInfo(topFunctionBody);
  local_b0 = (ScriptContext *)cache;
  if (cache->cloneForJitTimeUse == true) {
    bVar4 = Js::FunctionBody::PolyInliningUsingFixedMethodsAllowedByConfigFlags
                      (local_98,topFunctionBody);
    uVar22 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
  }
  else {
    uVar22 = 0;
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,EquivObjTypeSpecPhase,uVar5,LVar6);
  if (bVar4) {
    if ((char)uVar22 == '\0') {
      return (ObjTypeSpecFldInfo *)0x0;
    }
  }
  else if (((char)uVar22 == '\0') && (*(int *)&pDVar9->bits < 0)) {
    return (ObjTypeSpecFldInfo *)0x0;
  }
  uVar28 = *(ushort *)&(local_b0->super_ScriptContextBase).globalObject;
  local_40 = CONCAT44(local_40._4_4_,(uint)uVar28);
  if (uVar28 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2e3,"(cache->GetSize() < (65535))","cache->GetSize() < UINT16_MAX");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
    local_40 = CONCAT44(local_40._4_4_,
                        (uint)*(ushort *)&(local_b0->super_ScriptContextBase).globalObject);
  }
  local_78 = (local_b0->super_ScriptContextBase).javascriptLibrary;
  local_d4 = id;
  if (topFunctionBody == local_98) {
    local_48 = (Recycler *)((ulong)local_48 & 0xffffffff00000000);
  }
  else {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,DepolymorphizeInlineesPhase,uVar5,LVar6);
    local_48 = (Recycler *)(CONCAT44(local_48._4_4_,(int)CONCAT71(extraout_var_00,bVar4)) ^ 1);
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01439100,EquivObjTypeSpecPhase,uVar5,LVar6);
  uVar36 = CONCAT71(extraout_var_01,bVar4) & 0xffffffff;
  local_50 = (RecyclerJITTypeHolder *)CONCAT62((int6)((uint7)extraout_var_01 >> 8),0xffff);
  uVar20 = 1;
  local_a0 = (undefined4 *)__tls_get_addr();
  TVar24 = TypeIds_Limit;
  uVar25 = 0;
  local_68 = (Phases *)&DAT_01441eb0;
  uVar30 = 0;
  local_34 = (uint)CONCAT71(extraout_var_01,bVar4);
  local_88 = (PropertyGuard *)((ulong)local_88._4_4_ << 0x20);
  local_c8 = (FixedFieldInfo *)0x0;
  local_d0 = 0;
  local_b8 = 0;
  pvVar26 = (Var)0x0;
  local_e8 = 0;
  local_a8 = 0;
  local_e0 = (DynamicObject *)0x0;
  local_80 = CONCAT71(local_80._1_7_,(char)uVar36);
  pJVar21 = local_78;
  while( true ) {
    uVar32 = (uint)uVar20;
    if ((((((char)uVar36 == '\0') && (uVar20 == 0)) && ((uVar22 & 1) == 0)) &&
        (((ulong)local_48 & 1) == 0)) || ((ushort)local_40 <= (ushort)uVar30)) break;
    uVar34 = (ulong)((uVar30 & 0xffff) << 5);
    uVar10 = *(ulong *)((long)&(pJVar21->super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + uVar34);
    if (uVar10 != 0) {
      puVar35 = (ulong *)((long)&(pJVar21->super_JavascriptLibraryBase).super_FinalizableObject.
                                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + uVar34)
      ;
      uVar34 = uVar10 >> 0x10;
      if ((ushort)local_50 == 0xffff) {
        if ((puVar35[2] & 1) == 0) {
          if ((uVar10 & 1) == 0) {
            fixedProperty = pvVar26;
            local_bc = TVar24;
            local_90 = uVar25;
            if ((puVar35[1] & 1) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = local_a0;
              *local_a0 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                                 ,0x323,"(inlineCache.IsAccessor())","inlineCache.IsAccessor()");
              if (!bVar4) goto LAB_005a3725;
              *puVar8 = 0;
            }
            this_00 = local_98;
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_98);
            LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
            bVar4 = Js::Phases::IsEnabled(local_68,FixAccessorPropsPhase,uVar5,LVar6);
            uVar10 = CONCAT71(extraout_var_02,bVar4);
            if (bVar4) {
              local_34 = 0;
              uVar20 = 0;
              pvVar26 = fixedProperty;
              TVar24 = local_bc;
            }
            else {
              uVar32 = (uint)puVar35[1];
              local_c8 = (FixedFieldInfo *)(ulong)CONCAT31((int3)(~uVar32 >> 8),(~uVar32 & 3) == 0);
              local_88 = (PropertyGuard *)
                         CONCAT44(local_88._4_4_,CONCAT31((int3)(uVar32 >> 8),(byte)uVar32 >> 3));
              local_a8 = *puVar35;
              uVar22 = puVar35[2];
              TVar24 = *(TypeId *)(uVar22 & 0xfffffffffffffffb);
              pvVar26 = (Var)CONCAT71((int7)(uVar22 >> 8),(byte)uVar22 >> 2);
              local_e8 = (ulong)*(ushort *)((long)puVar35 + 10);
              uVar10 = CONCAT71((int7)((uVar22 & 0xfffffffffffffffb) >> 8),1);
              local_d0 = uVar10;
            }
            uVar22 = 0;
            uVar36 = local_80 & 0xff;
            uVar25 = local_90;
            pJVar21 = local_78;
          }
          else if ((uVar10 & 2) == 0) {
            uVar10 = puVar35[1];
            local_e0 = (DynamicObject *)puVar35[2];
            TVar24 = *(TypeId *)(uVar10 & 0xfffffffffffffffb);
            pvVar26 = (Var)CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 >> 2);
            uVar10 = CONCAT71((int7)((uVar10 & 0xfffffffffffffffb) >> 8),1);
            local_e8 = uVar34 & 0xffff;
            local_b8 = uVar10;
          }
          else {
            local_34 = 0;
            local_48 = (Recycler *)((ulong)local_48._4_4_ << 0x20);
            uVar20 = 0;
            uVar22 = 0;
          }
        }
        else {
          TVar24 = *(TypeId *)(uVar10 & 0xfffffffffffffffb);
          uVar10 = CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 >> 2);
          uVar22 = 0;
          local_e8 = (ulong)*(ushort *)((long)puVar35 + 0x12);
          uVar32 = (uint)local_48 & 0xff;
          if (puVar35[1] != 0) {
            uVar32 = 0;
          }
          local_48 = (Recycler *)CONCAT44(local_48._4_4_,uVar32);
          if (puVar35[1] != 0) {
            uVar20 = uVar22;
          }
          pvVar26 = (Var)(uVar10 & 0xffffffff);
        }
        if (((char)uVar36 == '\0') ||
           (local_50 = (RecyclerJITTypeHolder *)CONCAT62((int6)(uVar10 >> 0x10),0xffff),
           (local_34 & 1) != 0)) {
          local_50 = (RecyclerJITTypeHolder *)(ulong)uVar30;
        }
      }
      else {
        sVar27 = (short)local_e8;
        bVar31 = (byte)pvVar26;
        if ((puVar35[2] & 1) == 0) {
          if ((uVar10 & 1) == 0) {
            if ((sVar27 != *(short *)((long)puVar35 + 10)) ||
               (((uint)puVar35[2] >> 2 & 1) != (uint)(bVar31 & 1))) {
              uVar20 = 0;
            }
            if ((local_d0 & 1) != 0) {
              if ((((((~(uint)puVar35[1] & 3) == 0 ^ (byte)local_c8) & 1) == 0) &&
                  (((uint)puVar35[1] & 8) != 0)) &&
                 ((((ulong)local_88 & 1) != 0 && (local_a8 == uVar10)))) {
                uVar10 = puVar35[2];
                goto LAB_005a29d3;
              }
            }
            goto LAB_005a29db;
          }
          if ((sVar27 != (short)(uVar10 >> 0x10)) ||
             (((uint)puVar35[1] >> 2 & 1) != (uint)(bVar31 & 1))) {
            uVar20 = 0;
          }
          if (((((local_b8 & 1) == 0) || ((local_d0 & 1) != 0)) ||
              (local_e0 != (DynamicObject *)puVar35[2])) ||
             (TVar24 != *(TypeId *)(puVar35[1] & 0xfffffffffffffffb))) {
            local_48 = (Recycler *)((ulong)local_48._4_4_ << 0x20);
            uVar20 = 0;
          }
        }
        else {
          if ((sVar27 != *(short *)((long)puVar35 + 0x12)) ||
             (((uint)(uVar10 >> 2) & 1) != (uint)(bVar31 & 1))) {
            uVar20 = 0;
          }
          if ((((local_b8 & 1) == 0) && ((local_d0 & 1) == 0)) && (puVar35[1] == 0)) {
LAB_005a29d3:
            if (TVar24 != *(TypeId *)(uVar10 & 0xfffffffffffffffb)) goto LAB_005a29db;
          }
          else {
LAB_005a29db:
            local_48 = (Recycler *)((ulong)local_48._4_4_ << 0x20);
            uVar20 = 0;
          }
          uVar22 = 0;
        }
      }
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    uVar30 = uVar30 + 1;
  }
  local_52 = (uint16)uVar25;
  if ((ushort)local_50 == 0xffff) {
    if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
      inlineCacheStats->emptyPolyInlineCacheCount = inlineCacheStats->emptyPolyInlineCacheCount + 1;
    }
    return (ObjTypeSpecFldInfo *)0x0;
  }
  local_58 = local_34 & 0xff;
  bVar4 = *(char *)((long)&(local_b0->super_ScriptContextBase).globalObject + 2) != '\0';
  if (bVar4) {
    local_58 = 0;
  }
  local_34 = 0;
  if (bVar4) {
    uVar32 = 0;
  }
  bVar31 = (byte)uVar22 & local_52 < 5;
  uVar22 = CONCAT71((int7)(uVar22 >> 8),bVar31);
  if (uVar32 == 0) {
    if ((local_58 & 1) == 0) {
      if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
        inlineCacheStats->nonEquivPolyInlineCacheCount =
             inlineCacheStats->nonEquivPolyInlineCacheCount + 1;
      }
      *(undefined1 *)((long)&(local_b0->super_ScriptContextBase).globalObject + 2) = 1;
      if (bVar31 == 0) {
        local_34 = (uint)local_48;
        if (((ulong)local_48 & 1) == 0) {
          return (ObjTypeSpecFldInfo *)0x0;
        }
      }
      else {
        local_34 = (uint)local_48;
      }
    }
    else {
      local_34 = 0;
    }
  }
  local_68 = (Phases *)CONCAT44(local_68._4_4_,(int)uVar22);
  cVar29 = (char)uVar36;
  local_6c = uVar32;
  if ((ushort)local_40 <= (ushort)local_50) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = local_a0;
    *local_a0 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38c,"(firstNonEmptyCacheIndex < polyCacheSize)",
                       "firstNonEmptyCacheIndex < polyCacheSize");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
    uVar22 = (ulong)local_68 & 0xffffffff;
    cVar29 = (char)local_80;
  }
  if (TVar24 == TypeIds_Limit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = local_a0;
    *local_a0 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38d,"(typeId != Js::TypeIds_Limit)","typeId != Js::TypeIds_Limit");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
    uVar22 = (ulong)local_68 & 0xffffffff;
    cVar29 = (char)local_80;
  }
  if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
    inlineCacheStats->equivPolyInlineCacheCount = inlineCacheStats->equivPolyInlineCacheCount + 1;
  }
  if (cVar29 != '\0') {
    iVar7 = (int)local_40;
    if ((((byte)local_6c ^ (byte)local_58) & 1) != 0) {
      iVar7 = (int)local_50 + 1;
    }
    local_40 = CONCAT44(local_40._4_4_,iVar7);
  }
  fixedProperty = pvVar26;
  local_bc = TVar24;
  this_01 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_98);
  local_48 = this_01->recycler;
  memset(local_438,0,0x180);
  local_f8 = (Var)0x0;
  if ((((local_b8 & 1) != 0) || (((ulong)local_88 & 1) != 0)) &&
     (((local_6c & 1) != 0 || ((local_58 & 1) != 0)))) {
    propertyId = Js::FunctionBody::GetPropertyIdFromCacheId(local_98,local_5c);
    pPVar11 = Js::ScriptContext::GetPropertyName(this_01,propertyId);
    if ((local_b8 & 1) == 0) {
      if (((ulong)local_88 & 1) != 0) {
        plVar1 = *(long **)(*(long *)(local_a8 + 8) + 0x28);
        (**(code **)(*plVar1 + 0x2d8))(plVar1,pPVar11,&local_f8,4,(byte)local_c8 & 1);
      }
    }
    else {
      plVar1 = *(long **)((local_e0->super_RecyclableObject).type.ptr + 1);
      (**(code **)(*plVar1 + 0x2d0))(plVar1,pPVar11,&local_f8,3,this_01);
    }
    FixedFieldInfo::PopulateFixedField((Type *)0x0,local_f8,(FixedFieldInfo *)local_438);
  }
  pRVar3 = local_50;
  localTypes[0x1f] = (Type *)0x0;
  uVar36 = (ulong)local_50 & 0xffff;
  uVar20 = local_40 & 0xffff;
  local_50 = (RecyclerJITTypeHolder *)CONCAT71(local_50._1_7_,(byte)local_6c | (byte)local_58);
  this_06 = (InlineCache *)
            (&(local_78->super_JavascriptLibraryBase).super_FinalizableObject +
            ((ulong)pRVar3 & 0xffff) * 4);
  uVar28 = 0;
  local_78 = (JavascriptLibrary *)((ulong)local_78 & 0xffffffff00000000);
  cVar29 = (char)local_80;
  local_b0 = this_01;
  local_90 = uVar25;
  local_40 = uVar20;
  while( true ) {
    puVar8 = local_a0;
    if (uVar20 <= uVar36) break;
    uVar10 = *(ulong *)&this_06->u;
    if (uVar10 != 0) {
      if ((undefined1  [24])((undefined1  [24])this_06->u & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) {
        if ((uVar10 & 1) == 0) {
          uVar10 = *(ulong *)((long)&this_06->u + 0x10);
          type = (Type *)(uVar10 & 0xfffffffffffffffb);
          localTypes[(ulong)uVar28 - 1] = type;
          if ((local_34 & 1) != 0) {
            TVar19 = (this_06->u).accessor.slotIndex;
            goto LAB_005a2eda;
          }
        }
        else {
          uVar34 = *(ulong *)((long)&this_06->u + 8);
          type = (Type *)(uVar34 & 0xfffffffffffffffb);
          localTypes[(ulong)uVar28 - 1] = type;
          if ((local_34 & 1) != 0) {
            pOVar18 = localPolymorphicInfo + ((ulong)uVar28 - 2);
            (pOVar18->m_data).slotIndex = (Type)(uVar10 >> 0x10);
            bVar31 = (byte)uVar34;
            goto LAB_005a2f0c;
          }
        }
      }
      else {
        type = (Type *)(uVar10 & 0xfffffffffffffffb);
        localTypes[(ulong)uVar28 - 1] = type;
        if ((local_34 & 1) != 0) {
          TVar19 = (this_06->u).local.slotIndex;
LAB_005a2eda:
          bVar31 = (byte)uVar10;
          pOVar18 = localPolymorphicInfo + ((ulong)uVar28 - 2);
          (pOVar18->m_data).slotIndex = TVar19;
LAB_005a2f0c:
          (pOVar18->m_data).usesAuxSlot = bVar31 >> 2 & 1;
        }
      }
      if ((uVar22 & 1) != 0) {
        local_68 = (Phases *)CONCAT44(local_68._4_4_,(int)uVar22);
        local_120 = (undefined **)0x0;
        Js::InlineCache::TryGetFixedMethodFromCache
                  (this_06,local_98,local_5c,(JavascriptFunction **)&stack0xfffffffffffffee0);
        if (((JavascriptFunction *)local_120 == (JavascriptFunction *)0x0) ||
           ((((((JavascriptFunction *)local_120)->functionInfo).ptr)->functionBodyImpl).ptr ==
            (FunctionProxy *)0x0)) {
          if (((ulong)local_50 & 1) == 0) {
            return (ObjTypeSpecFldInfo *)0x0;
          }
          uVar28 = uVar28 + 1;
          uVar22 = 0;
          uVar25 = local_90;
          uVar20 = local_40;
          cVar29 = (char)local_80;
          goto LAB_005a2fba;
        }
        FixedFieldInfo::PopulateFixedField
                  (type,local_120,
                   (FixedFieldInfo *)
                   &localFixedFieldInfoArray[(ulong)uVar28 - 1].m_data.environmentAddr);
        local_78 = (JavascriptLibrary *)CONCAT44(local_78._4_4_,(int)local_78 + 1);
        uVar22 = (ulong)local_68 & 0xffffffff;
        uVar25 = local_90;
        uVar20 = local_40;
        cVar29 = (char)local_80;
      }
      uVar28 = uVar28 + 1;
    }
LAB_005a2fba:
    uVar36 = uVar36 + 1;
    this_06 = this_06 + 1;
  }
  if (((byte)local_d0 & (byte)uVar22 & 1 < (ushort)local_78) == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x3fb,"(fixedFunctionCount <= 1)","fixedFunctionCount <= 1");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
    cVar29 = (char)local_80;
  }
  if ((cVar29 != '\0') && ((((byte)local_6c ^ (byte)local_58) & 1) != 0)) {
    local_52 = 1;
    uVar25 = CONCAT62((int6)(uVar25 >> 0x10),1);
  }
  if (uVar28 != (ushort)uVar25) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x403,"(typeNumber == typeCount)","typeNumber == typeCount");
    if (!bVar4) goto LAB_005a3725;
    *puVar8 = 0;
  }
  pJVar21 = (JavascriptLibrary *)((ulong)local_78 & 0xffff);
  local_90 = uVar25;
  local_78 = pJVar21;
  if ((uVar22 & 1) == 0) {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = (JavascriptLibrary *)0x1;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x411;
    pRVar12 = Memory::Recycler::TrackAllocInfo(local_48,(TrackAllocData *)&stack0xfffffffffffffee0);
    pJVar21 = (JavascriptLibrary *)0x1;
  }
  else {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x40b;
    local_110 = pJVar21;
    pRVar12 = Memory::Recycler::TrackAllocInfo(local_48,(TrackAllocData *)&stack0xfffffffffffffee0);
  }
  local_c8 = Memory::AllocateArray<Memory::Recycler,FixedFieldInfo,false>
                       ((Memory *)pRVar12,(Recycler *)Memory::Recycler::AllocZero,0,(size_t)pJVar21)
  ;
  Memory::CopyArray<FixedFieldInfo,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            (local_c8,(size_t)pJVar21,(FixedFieldInfo *)local_438,(size_t)pJVar21);
  uVar5 = Js::FunctionBody::GetPropertyIdFromCacheId(local_98,local_5c);
  this_02 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  local_5c = uVar5;
  pPVar13 = NativeEntryPointData::RegisterSharedPropertyGuard(this_02,uVar5,local_b0);
  local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)pPVar13 >> 8),1));
  if ((uVar22 & 1) == 0) {
    if ((local_b8 & 1) == 0) {
      local_40 = (ulong)local_40._4_4_ << 0x20;
      if ((((ulong)local_88 & 1) != 0) && (((ulong)local_50 & 1) != 0)) goto LAB_005a31bb;
    }
    else if (((local_6c & 1) == 0) && ((local_58 & 1) == 0)) {
      local_40 = (ulong)local_40._4_4_ << 0x20;
    }
    else {
LAB_005a31bb:
      iVar14 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)local_438);
      local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)iVar14 >> 8),iVar14 != 0));
    }
  }
  local_98 = (FunctionBody *)Js::EntryPointInfo::GetJitTransferData(entryPoint);
  pRVar12 = local_48;
  if (local_98 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x423,"(jitTransferData != nullptr)","jitTransferData != nullptr");
    if (!bVar4) {
LAB_005a3725:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  bVar31 = (byte)local_50 ^ 1;
  local_88 = pPVar13;
  if (((ulong)local_50 & 1) == 0) {
    if ((local_34 & 1) == 0) {
      this_04 = (EquivalentTypeSet *)0x0;
      local_68 = (Phases *)0x0;
      local_a0 = (undefined4 *)0x0;
      goto LAB_005a34c3;
    }
LAB_005a3271:
    local_a8 = CONCAT71(local_a8._1_7_,(byte)local_50) ^ 1;
    SortTypesAndPolymorphicInfo
              ((Type **)&localFixedFieldInfoArray[3].m_data.environmentAddr,
               (ObjTypeSpecPolymorphicInfo *)(localTypes + 0x1f),&local_52);
    uVar22 = (ulong)local_52;
    local_120 = &ObjTypeSpecPolymorphicInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    sVar23 = (size_t)local_52;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x430;
    local_110 = (JavascriptLibrary *)sVar23;
    pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)&stack0xfffffffffffffee0);
    local_68 = (Phases *)
               Memory::AllocateArray<Memory::Recycler,ObjTypeSpecPolymorphicInfo,false>
                         ((Memory *)pRVar15,(Recycler *)Memory::Recycler::AllocLeaf,0,sVar23);
    local_e8 = CONCAT62((int6)((ulong)local_68 >> 0x10),0xffff);
    local_a0 = (undefined4 *)uVar22;
    local_90 = uVar22;
  }
  else {
    if ((local_34 & 1) != 0) goto LAB_005a3271;
    local_a8 = CONCAT71(local_a8._1_7_,(byte)local_50) ^ 1;
    sVar23 = local_90 & 0xffff;
    local_68 = (Phases *)0x0;
    local_a0 = (undefined4 *)0x0;
  }
  local_120 = &JITTypeHolderBase<Memory::Recycler>::typeinfo;
  fixedFunctionObject = (JavascriptFunction *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
  ;
  local_100 = 0x433;
  local_110 = (JavascriptLibrary *)sVar23;
  pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)&stack0xfffffffffffffee0);
  lVar33 = 0;
  pJVar16 = Memory::AllocateArray<Memory::Recycler,JITTypeHolderBase<Memory::Recycler>,false>
                      ((Memory *)pRVar15,(Recycler *)Memory::Recycler::Alloc,0,sVar23);
  local_50 = pJVar16;
  local_80 = sVar23;
  for (sVar23 = 0; local_80 != sVar23; sVar23 = sVar23 + 1) {
    this = (DynamicType *)localTypes[sVar23 - 1];
    JitTransferData::AddJitTimeTypeRef((JitTransferData *)local_98,this,pRVar12);
    if ((((char)local_40 != '\0') && (bVar4 = Js::DynamicType::Is((Type *)this), bVar4)) &&
       (this->isLocked == false)) {
      Js::DynamicType::LockType(this);
    }
    local_120 = &JITType::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = (JavascriptLibrary *)0xffffffffffffffff;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x447;
    pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)&stack0xfffffffffffffee0);
    this_03 = (JITType *)new<Memory::Recycler>(0x40,pRVar12,0x37a1d4);
    JITType::JITType(this_03);
    Memory::WriteBarrierPtr<JITType>::WriteBarrierSet
              ((WriteBarrierPtr<JITType> *)((long)&(pJVar16->t).ptr + lVar33),this_03);
    JITType::BuildFromJsType((Type *)this,pJVar16[sVar23].t.ptr);
    if ((local_34 & 1) != 0) {
      *(Type *)((long)local_68 + sVar23 * 4) = localPolymorphicInfo[sVar23 - 2].m_data;
    }
    lVar33 = lVar33 + 8;
    pRVar12 = local_48;
  }
  local_120 = &Js::EquivalentTypeSet::typeinfo;
  fixedFunctionObject = (JavascriptFunction *)0x0;
  local_110 = (JavascriptLibrary *)0xffffffffffffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
  ;
  local_100 = 0x450;
  pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)&stack0xfffffffffffffee0);
  this_04 = (EquivalentTypeSet *)new<Memory::Recycler>(0x10,pRVar15,0x37a1d4);
  Js::EquivalentTypeSet::EquivalentTypeSet(this_04,local_50,(uint16)local_90);
  if ((local_34 & 1) != 0) {
    this_04->sortedAndDuplicatesRemoved = true;
  }
  bVar31 = (byte)local_a8;
LAB_005a34c3:
  pPVar13 = local_88;
  local_120 = &typeinfo;
  fixedFunctionObject = (JavascriptFunction *)0x0;
  local_110 = (JavascriptLibrary *)0xffffffffffffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
  ;
  local_100 = 0x45a;
  pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,(TrackAllocData *)&stack0xfffffffffffffee0);
  this_05 = (ObjTypeSpecFldInfo *)new<Memory::Recycler>(0x50,pRVar12,0x37a1d4);
  bVar4 = (bool)(char)local_40;
  local_40 = CONCAT44(local_40._4_4_,(uint)(ushort)local_e8);
  ObjTypeSpecFldInfo(this_05,local_d4,local_bc,(JITType *)0x0,this_04,
                     (bool)((byte)fixedProperty & 1),(bool)((byte)local_b8 & 1),
                     (bool)((byte)local_d0 & 1),bVar4,bVar4,(bool)(bVar31 & 1),true,(ushort)local_e8
                     ,local_5c,local_e0,pPVar13,(JITTimeConstructorCache *)0x0,local_c8,
                     (uint16)local_78,(uint16)local_a0,(ObjTypeSpecPolymorphicInfo *)local_68);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar5,LVar6);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar5,LVar6);
    if (!bVar4) {
      return this_05;
    }
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar5,LVar6);
  if (bVar4) {
    if (this_04 == (EquivalentTypeSet *)0x0) {
      return this_05;
    }
  }
  else {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar5,LVar6);
    if (this_04 == (EquivalentTypeSet *)0x0) {
      return this_05;
    }
    if (!bVar4) {
      return this_05;
    }
  }
  uVar5 = local_5c;
  pPVar11 = Js::ScriptContext::GetPropertyName(local_b0,local_5c);
  Output::Print(L"Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: ",
                (ulong)local_d4,pPVar11 + 1,(ulong)uVar5,local_40 & 0xffffffff);
  uVar32 = (uint)local_52;
  for (uVar30 = 0; (int)(uVar30 & 0xffff) < (int)(uVar32 - 1); uVar30 = (uVar30 & 0xffff) + 1) {
    JVar17 = Js::EquivalentTypeSet::GetType(this_04,(uint16)uVar30);
    Output::Print(L"0x%p, ",JVar17.t);
  }
  JVar17 = Js::EquivalentTypeSet::GetType(this_04,(uint16)(uVar32 - 1));
  Output::Print(L"0x%p\n",JVar17.t);
  Output::Flush();
  return this_05;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfo::CreateFrom(uint id, Js::PolymorphicInlineCache* cache, uint cacheId,
    Js::EntryPointInfo *entryPoint, Js::FunctionBody* const topFunctionBody, Js::FunctionBody *const functionBody, Js::FieldAccessStatsPtr inlineCacheStats)
{

#ifdef FIELD_ACCESS_STATS
#define IncInlineCacheCount(counter) if (inlineCacheStats) { inlineCacheStats->counter++; }
#else
#define IncInlineCacheCount(counter)
#endif

    Assert(topFunctionBody->HasDynamicProfileInfo());
    auto profileData = topFunctionBody->GetAnyDynamicProfileInfo();

    bool gatherDataForInlining = cache->GetCloneForJitTimeUse() && functionBody->PolyInliningUsingFixedMethodsAllowedByConfigFlags(topFunctionBody);

    if (PHASE_OFF(Js::EquivObjTypeSpecPhase, topFunctionBody) || profileData->IsEquivalentObjTypeSpecDisabled())
    {
        if (!gatherDataForInlining)
        {
            return nullptr;
        }
    }

    Assert(cache->GetSize() < UINT16_MAX);
    Js::InlineCache* inlineCaches = cache->GetInlineCaches();
    Js::DynamicObject* prototypeObject = nullptr;
    Js::DynamicObject* accessorOwnerObject = nullptr;
    Js::TypeId typeId = Js::TypeIds_Limit;
    uint16 polyCacheSize = (uint16)cache->GetSize();
    uint16 firstNonEmptyCacheIndex = UINT16_MAX;
    uint16 slotIndex = 0;
    bool areEquivalent = true;
    bool canDepolymorphize = topFunctionBody != functionBody && !PHASE_OFF(Js::DepolymorphizeInlineesPhase, topFunctionBody);
    bool usesAuxSlot = false;
    bool isProto = false;
    bool isAccessor = false;
    bool isGetterAccessor = false;
    bool isAccessorOnProto = false;

    bool stress = PHASE_STRESS(Js::EquivObjTypeSpecPhase, topFunctionBody);
    bool areStressEquivalent = stress;

    uint16 typeCount = 0;
    for (uint16 i = 0; (areEquivalent || stress || gatherDataForInlining || canDepolymorphize) && i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (firstNonEmptyCacheIndex == UINT16_MAX)
        {
            if (inlineCache.IsLocal())
            {
                typeId = TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId();
                usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.local.type);
                slotIndex = inlineCache.u.local.slotIndex;
                // We don't support equivalent object type spec for adding properties.
                if (inlineCache.u.local.typeWithoutProperty != nullptr)
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            // Missing properties cannot be treated as equivalent, because for objects with SDTH or DTH, we don't change the object's type
            // when we add a property.  We also don't invalidate proto inline caches (and guards) unless the property being added exists on the proto chain.
            // Missing properties by definition do not exist on the proto chain, so in the end we could have an EquivalentObjTypeSpec cache hit on a
            // property that once was missing, but has since been added. (See OS Bugs 280582).
            else if (inlineCache.IsProto())
            {
                if(!inlineCache.u.proto.isMissing)
                {
                    isProto = true;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.proto.type);
                    slotIndex = inlineCache.u.proto.slotIndex;
                    prototypeObject = inlineCache.u.proto.prototypeObject;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                    canDepolymorphize = false;
                    gatherDataForInlining = false;
                }
            }
            else
            {
                AssertOrFailFast(inlineCache.IsAccessor());
                if (!PHASE_OFF(Js::FixAccessorPropsPhase, functionBody))
                {
                    isAccessor = true;
                    isGetterAccessor = inlineCache.IsGetterAccessor();
                    isAccessorOnProto = inlineCache.u.accessor.isOnProto;
                    accessorOwnerObject = inlineCache.u.accessor.object;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.accessor.type);
                    slotIndex = inlineCache.u.accessor.slotIndex;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                }
                gatherDataForInlining = false;
            }

            // If we're stressing equivalent object type spec then let's keep trying to find a cache that we could use.
            if (!stress || areStressEquivalent)
            {
                firstNonEmptyCacheIndex = i;
            }
        }
        else
        {
            if (inlineCache.IsLocal())
            {
                if (slotIndex != inlineCache.u.local.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.local.type))
                {
                    areEquivalent = false;
                }
                if (isProto || isAccessor || inlineCache.u.local.typeWithoutProperty != nullptr || typeId != TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            else if (inlineCache.IsProto())
            {
                if (slotIndex != inlineCache.u.proto.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.proto.type))
                {
                    areEquivalent = false;
                }
                if (!isProto || isAccessor || prototypeObject != inlineCache.u.proto.prototypeObject || typeId != TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
            }
            else
            {
                // Supporting equivalent obj type spec only for those polymorphic accessor property operations for which
                // 1. the property is on the same prototype, and
                // 2. the types are equivalent.
                //
                // This is done to keep the equivalence check helper as-is
                if (slotIndex != inlineCache.u.accessor.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.accessor.type))
                {
                    areEquivalent = false;
                }
                if (!isAccessor || isGetterAccessor != inlineCache.IsGetterAccessor() || !isAccessorOnProto || !inlineCache.u.accessor.isOnProto ||
                    accessorOwnerObject != inlineCache.u.accessor.object || typeId != TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
        }
        typeCount++;
    }

    if (firstNonEmptyCacheIndex == UINT16_MAX)
    {
        IncInlineCacheCount(emptyPolyInlineCacheCount);
        return nullptr;
    }

    if (cache->GetIgnoreForEquivalentObjTypeSpec())
    {
        areEquivalent = areStressEquivalent = false;
    }

#if ENABLE_FIXED_FIELDS
    gatherDataForInlining = gatherDataForInlining && (typeCount <= 4); // Only support 4-way (max) polymorphic inlining
#else
    gatherDataForInlining = false;
#endif

    bool depolymorphize = false;
    if (!areEquivalent && !areStressEquivalent)
    {
        IncInlineCacheCount(nonEquivPolyInlineCacheCount);
        cache->SetIgnoreForEquivalentObjTypeSpec(true);
        // Only do depolymorphication bookkeeping if we're in an inlinee and types are not equivalent
        depolymorphize = canDepolymorphize;
        if (!gatherDataForInlining && !depolymorphize)
        {
            return nullptr;
        }
    }

    Assert(firstNonEmptyCacheIndex < polyCacheSize);
    Assert(typeId != Js::TypeIds_Limit);
    IncInlineCacheCount(equivPolyInlineCacheCount);

    // If we're stressing equivalent object type spec and the types are not equivalent, let's grab the first one only.
    if (stress && (areEquivalent != areStressEquivalent))
    {
        polyCacheSize = firstNonEmptyCacheIndex + 1;
    }

    Js::ScriptContext* scriptContext = functionBody->GetScriptContext();
    Recycler* recycler = scriptContext->GetRecycler();

    uint16 fixedFunctionCount = 0;

    // Need to create a local array here and not allocate one from the recycler,
    // as the allocation may trigger a GC which can clear the inline caches.
    FixedFieldInfo localFixedFieldInfoArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

#if ENABLE_FIXED_FIELDS
    // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
    // Since all types in the polymorphic cache share the same prototype, it's enough to grab the fixed function from the prototype object.
    Js::Var fixedProperty = nullptr;
    if ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent))
    {
        const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(cacheId));
        if (isProto)
        {
            prototypeObject->GetDynamicType()->GetTypeHandler()->TryUseFixedProperty(propertyRecord, &fixedProperty, (Js::FixedPropertyKind)(Js::FixedPropertyKind::FixedMethodProperty | Js::FixedPropertyKind::FixedDataProperty), scriptContext);
        }
        else if (isAccessorOnProto)
        {
            accessorOwnerObject->GetDynamicType()->GetTypeHandler()->TryUseFixedAccessor(propertyRecord, &fixedProperty, Js::FixedPropertyKind::FixedAccessorProperty, isGetterAccessor, scriptContext);
        }

        FixedFieldInfo::PopulateFixedField(nullptr, fixedProperty, &localFixedFieldInfoArray[0]);

        // TODO (ObjTypeSpec): Enable constructor caches on equivalent polymorphic field loads with fixed functions.
    }
#endif
    // Let's get the types.
    Js::Type* localTypes[MaxPolymorphicInlineCacheSize];
    ObjTypeSpecPolymorphicInfo localPolymorphicInfo[MaxPolymorphicInlineCacheSize];

    uint16 typeNumber = 0;
    for (uint16 i = firstNonEmptyCacheIndex; i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (inlineCache.IsLocal())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.local.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.local.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.local.type));
            }
        }
        else if (inlineCache.IsProto())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.proto.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.proto.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.proto.type));
            }
        }
        else
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.accessor.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.accessor.type));
            }
        }

#if ENABLE_FIXED_FIELDS
        if (gatherDataForInlining)
        {
            Js::JavascriptFunction* fixedFunctionObject = nullptr;
            inlineCache.TryGetFixedMethodFromCache(functionBody, cacheId, &fixedFunctionObject);
            if (!fixedFunctionObject || !fixedFunctionObject->GetFunctionInfo()->HasBody())
            {
                if (!(areEquivalent || areStressEquivalent))
                {
                    // If we reach here only because we are gathering data for inlining, and one of the Inline Caches doesn't have a fixedfunction object, return.
                    return nullptr;
                }
                else
                {
                    // If one of the inline caches doesn't have a fixed function object, abort gathering inlining data.
                    gatherDataForInlining = false;
                    typeNumber++;
                    continue;
                }
            }

            // We got a fixed function object from the cache.

            FixedFieldInfo::PopulateFixedField(localTypes[typeNumber], fixedFunctionObject, &localFixedFieldInfoArray[typeNumber]);

            fixedFunctionCount++;
        }
#endif
        typeNumber++;
    }

    if (isAccessor && gatherDataForInlining)
    {
        Assert(fixedFunctionCount <= 1);
    }

    if (stress && (areEquivalent != areStressEquivalent))
    {
        typeCount = 1;
    }

    AnalysisAssert(typeNumber == typeCount);

    // Now that we've copied all material info into local variables, we can start allocating without fear
    // that a garbage collection will clear any of the live inline caches.

    FixedFieldInfo* fixedFieldInfoArray;
    if (gatherDataForInlining)
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, fixedFunctionCount);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(
            fixedFieldInfoArray, fixedFunctionCount, localFixedFieldInfoArray, fixedFunctionCount);
    }
    else
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, 1);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(fixedFieldInfoArray, 1, localFixedFieldInfoArray, 1);
    }

    Js::PropertyId propertyId = functionBody->GetPropertyIdFromCacheId(cacheId);
    Js::PropertyGuard* propertyGuard = entryPoint->GetNativeEntryPointData()->RegisterSharedPropertyGuard(propertyId, scriptContext);

    // For polymorphic, non-equivalent objTypeSpecFldInfo's, hasFixedValue is true only if each of the inline caches has a fixed function for the given cacheId, or
    // in the case of an accessor cache, only if the there is only one version of the accessor.
    bool hasFixedValue = gatherDataForInlining ||
        ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent) && localFixedFieldInfoArray[0].GetFieldValue());

    bool doesntHaveEquivalence = !(areEquivalent || areStressEquivalent);

    Js::EquivalentTypeSet* typeSet = nullptr;
    ObjTypeSpecPolymorphicInfo * polymorphicInfoArray = nullptr;
    uint16 polymorphicInfoCount = 0;
    auto jitTransferData = entryPoint->GetJitTransferData();
    Assert(jitTransferData != nullptr);
    if (areEquivalent || areStressEquivalent || depolymorphize)
    {
        if (depolymorphize)
        {
            // Because we require the ordering of the polymorphic info to match the equivalent type set, and because there are places in the code
            // where the equivalent type set gets sorted without touching the polymorphic info, and may be more of them in future, just sort
            // them both now before anyone can use them.
            SortTypesAndPolymorphicInfo(localTypes, localPolymorphicInfo, &typeCount);

            // We don't have a single known slot index. We have one per type in the set. GlobOpt will sort out which one to use.
            slotIndex = Js::Constants::NoSlot;
            polymorphicInfoCount = typeCount;
            polymorphicInfoArray = RecyclerNewArrayLeaf(recycler, ObjTypeSpecPolymorphicInfo, typeCount);
        }

        RecyclerJITTypeHolder* types = RecyclerNewArray(recycler, RecyclerJITTypeHolder, typeCount);

        for (uint16 i = 0; i < typeCount; i++)
        {
            jitTransferData->AddJitTimeTypeRef(localTypes[i], recycler);
            if (hasFixedValue)
            {
                // Fixed field checks allow us to assume a specific type ID, but the assumption is only
                // valid if we lock the type. Otherwise, the type ID may change out from under us without
                // evolving the type.
                if (Js::DynamicType::Is(localTypes[i]))
                {
                    Js::DynamicType *dynamicType = static_cast<Js::DynamicType*>(localTypes[i]);
                    if (!dynamicType->GetIsLocked())
                    {
                        dynamicType->LockType();
                    }
                }
            }
            // TODO: OOP JIT, consider putting these inline
            types[i].t = RecyclerNew(recycler, JITType);
            __analysis_assume(localTypes[i] != nullptr);
            JITType::BuildFromJsType(localTypes[i], types[i].t);

            if (depolymorphize)
            {
                polymorphicInfoArray[i] = localPolymorphicInfo[i];
            }
        }
        typeSet = RecyclerNew(recycler, Js::EquivalentTypeSet, types, typeCount);
        if (depolymorphize)
        {
            // We sorted the set above.
            typeSet->SetSortedAndDuplicatesRemoved(true);
        }
    }

    ObjTypeSpecFldInfo* info = RecyclerNew(recycler, ObjTypeSpecFldInfo,
        id, typeId, nullptr, typeSet, usesAuxSlot, isProto, isAccessor, hasFixedValue, hasFixedValue, doesntHaveEquivalence, true, slotIndex, propertyId,
        prototypeObject, propertyGuard, nullptr, fixedFieldInfoArray, fixedFunctionCount, polymorphicInfoCount, polymorphicInfoArray);

    if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
    {
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            if (typeSet)
            {
                const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
                Output::Print(_u("Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: "),
                    id, propertyRecord->GetBuffer(), propertyId, slotIndex);
                for (uint16 ti = 0; ti < typeCount - 1; ti++)
                {
                    Output::Print(_u("0x%p, "), typeSet->GetType(ti));
                }
                Output::Print(_u("0x%p\n"), typeSet->GetType(typeCount - 1));
                Output::Flush();
            }
        }
    }

    return info;

#undef IncInlineCacheCount
}